

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O0

void __thiscall
webfront::fs::File::File
          (File *this,span<const_unsigned_long,_18446744073709551615UL> input,size_t fileSize,
          string_view contentEncoding)

{
  allocator<char> *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator<char> local_31;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  
  *(undefined4 *)&in_RDI->_M_len = 1;
  in_RDI->_M_str = in_RSI;
  in_RDI[1]._M_len = in_RDX;
  in_RDI[1]._M_str = (char *)0x0;
  in_RDI[2]._M_len = (size_t)in_RCX;
  *(bool *)&in_RDI[2]._M_str = in_RCX == (allocator<char> *)0x0;
  __t = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_R8,__t,in_RCX);
  std::allocator<char>::~allocator(&local_31);
  std::ifstream::ifstream(in_RDI + 5);
  return;
}

Assistant:

File(std::span<const uint64_t> input, size_t fileSize, std::string_view contentEncoding = "")
        : fileType{FileType::staticData}, data(input), size(fileSize), eofBit(fileSize==0), encoding(contentEncoding) {}